

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O3

QByteArray * __thiscall
QMetaEnumBuilder::key(QByteArray *__return_storage_ptr__,QMetaEnumBuilder *this,int index)

{
  Data *pDVar1;
  QMetaEnumBuilderPrivate *pQVar2;
  pointer pQVar3;
  ulong uVar4;
  
  pQVar2 = d_func(this);
  if ((index < 0 || pQVar2 == (QMetaEnumBuilderPrivate *)0x0) ||
     (uVar4 = (ulong)(uint)index, (ulong)(pQVar2->keys).d.size <= uVar4)) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    pQVar3 = QList<QByteArray>::data(&pQVar2->keys);
    pDVar1 = pQVar3[uVar4].d.d;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = pQVar3[uVar4].d.ptr;
    (__return_storage_ptr__->d).size = pQVar3[uVar4].d.size;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray QMetaEnumBuilder::key(int index) const
{
    QMetaEnumBuilderPrivate *d = d_func();
    if (d && index >= 0 && index < d->keys.size())
        return d->keys[index];
    else
        return QByteArray();
}